

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O0

void __thiscall despot::BaseRockSample::Init_11_11(BaseRockSample *this)

{
  ostream *this_00;
  int *piVar1;
  int local_78;
  int local_74;
  int i;
  Coord local_68 [8];
  Coord aCStack_60 [8];
  Coord aCStack_58 [8];
  Coord aCStack_50 [8];
  Coord aCStack_48 [8];
  Coord aCStack_40 [8];
  Coord aCStack_38 [8];
  Coord aCStack_30 [8];
  Coord aCStack_28 [8];
  Coord aCStack_20 [8];
  Coord aCStack_18 [8];
  BaseRockSample *local_10;
  BaseRockSample *this_local;
  
  local_10 = this;
  this_00 = std::operator<<((ostream *)&std::cout,"Using special layout for rocksample(11, 11)");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  despot::Coord::Coord(local_68,0,3);
  despot::Coord::Coord(aCStack_60,0,7);
  despot::Coord::Coord(aCStack_58,1,8);
  despot::Coord::Coord(aCStack_50,2,4);
  despot::Coord::Coord(aCStack_48,3,3);
  despot::Coord::Coord(aCStack_40,3,8);
  despot::Coord::Coord(aCStack_38,4,3);
  despot::Coord::Coord(aCStack_30,5,8);
  despot::Coord::Coord(aCStack_28,6,1);
  despot::Coord::Coord(aCStack_20,9,3);
  despot::Coord::Coord(aCStack_18,9,9);
  despot::Coord::Coord((Coord *)&i,0,5);
  *(undefined8 *)&this->start_pos_ = _i;
  local_74 = -1;
  Grid<int>::SetAllValues(&this->grid_,&local_74);
  for (local_78 = 0; local_78 < this->num_rocks_; local_78 = local_78 + 1) {
    piVar1 = Grid<int>::operator()(&this->grid_,local_68 + (long)local_78 * 8);
    *piVar1 = local_78;
    std::vector<despot::Coord,_std::allocator<despot::Coord>_>::push_back
              (&this->rock_pos_,local_68 + (long)local_78 * 8);
  }
  return;
}

Assistant:

void BaseRockSample::Init_11_11() {
	// Equivalent to RockSample_11_11.pomdp(x)
	cout << "Using special layout for rocksample(11, 11)" << endl;

	Coord rocks[] = { Coord(0, 3), Coord(0, 7), Coord(1, 8), Coord(2, 4), Coord(
		3, 3), Coord(3, 8), Coord(4, 3), Coord(5, 8), Coord(6, 1), Coord(9, 3),
		Coord(9, 9) };

	start_pos_ = Coord(0, 5);
	grid_.SetAllValues(-1);
	for (int i = 0; i < num_rocks_; ++i) {
		grid_(rocks[i]) = i;
		rock_pos_.push_back(rocks[i]);
	}
}